

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::mock_hierarchy(Generator *top,string *top_name)

{
  element_type *this;
  bool bVar1;
  long lVar2;
  size_type sVar3;
  InternalException *this_00;
  Context *this_01;
  reference pvVar4;
  ulong uVar5;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *this_02;
  enable_shared_from_this<kratos::Generator> local_148;
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  local_138;
  _Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_> local_108;
  element_type *local_100;
  Generator *gen;
  string name;
  Generator *pGStack_d0;
  int i;
  Generator *pre;
  int start_index;
  Context *context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_38 [8];
  string instance_name;
  string *top_name_local;
  Generator *top_local;
  
  instance_name.field_2._8_8_ = top_name;
  std::__cxx11::string::string((string *)local_38,(string *)&top->instance_name);
  lVar2 = std::__cxx11::string::find((char)local_38,0x2e);
  if (lVar2 == -1) {
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,".",&local_79);
    string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_58,(string *)local_38,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    if (sVar3 < 2) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b0,"Cannot tokenize string ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      InternalException::InternalException(this_00,&local_b0);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_01 = Generator::context(top);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58);
    std::__cxx11::string::operator=((string *)&top->instance_name,(string *)pvVar4);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    pGStack_d0 = top;
    for (name.field_2._12_4_ = (int)sVar3 + -2; -1 < (int)name.field_2._12_4_;
        name.field_2._12_4_ = name.field_2._12_4_ + -1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_58,(long)(int)name.field_2._12_4_);
      std::__cxx11::string::string((string *)&gen,(string *)pvVar4);
      if (name.field_2._12_4_ == 0) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::__cxx11::string::operator=((string *)&gen,(string *)instance_name.field_2._8_8_);
        }
      }
      bVar1 = Context::generator_name_exists(this_01,(string *)&gen);
      if (bVar1) {
        Context::get_generators_by_name(&local_138,this_01,(string *)&gen);
        local_108._M_node =
             (_Base_ptr)
             std::
             set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ::begin(&local_138);
        this_02 = &std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_>::operator*
                             (&local_108)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
        local_100 = std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get(this_02);
        std::
        set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~set(&local_138);
      }
      else {
        local_100 = Context::generator(this_01,(string *)&gen);
      }
      this = local_100;
      std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_148);
      Generator::add_child_generator
                (this,&pGStack_d0->instance_name,(shared_ptr<kratos::Generator> *)&local_148);
      std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_148);
      pGStack_d0 = local_100;
      std::__cxx11::string::~string((string *)&gen);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void mock_hierarchy(Generator *top, const std::string &top_name) {
    // can only perform on the top layer
    auto instance_name = top->instance_name;
    if (instance_name.find('.') == std::string::npos) {
        return;
    }
    // need to tokenize based on the instance names
    auto names = string::get_tokens(instance_name, ".");
    if (names.size() < 2) throw InternalException("Cannot tokenize string " + instance_name);
    Context *context = top->context();
    top->instance_name = names.back();
    int start_index = static_cast<int>(names.size() - 2);
    Generator *pre = top;
    for (int i = start_index; i >= 0; i--) {
        // create a new generator
        std::string name = names[i];
        if (i == 0 && !top_name.empty()) name = top_name;
        Generator *gen;
        if (context->generator_name_exists(name)) {
            gen = (*(context->get_generators_by_name(name).begin())).get();
        } else {
            gen = &context->generator(name);
        }
        gen->add_child_generator(pre->instance_name, pre->shared_from_this());
        pre = gen;
    }
}